

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::internal::add_thousands_sep<wchar_t>::operator()
          (add_thousands_sep<wchar_t> *this,wchar_t **buffer)

{
  uint uVar1;
  size_t sVar2;
  wchar_t *__last;
  wchar_t *pwVar3;
  long *in_RSI;
  basic_string_view<wchar_t> *in_RDI;
  wchar_t *p;
  
  uVar1 = *(int *)&in_RDI[1].data_ + 1;
  *(uint *)&in_RDI[1].data_ = uVar1;
  if (uVar1 % 3 == 0) {
    sVar2 = basic_string_view<wchar_t>::size(in_RDI);
    *in_RSI = *in_RSI + sVar2 * -4;
    __last = basic_string_view<wchar_t>::data(in_RDI);
    pwVar3 = basic_string_view<wchar_t>::data(in_RDI);
    sVar2 = basic_string_view<wchar_t>::size(in_RDI);
    pwVar3 = pwVar3 + sVar2;
    p = (wchar_t *)*in_RSI;
    sVar2 = basic_string_view<wchar_t>::size(in_RDI);
    make_checked<wchar_t>(p,sVar2);
    std::uninitialized_copy<wchar_t_const*,wchar_t*>(pwVar3,__last,p);
  }
  return;
}

Assistant:

void operator()(Char *&buffer) {
    if (++digit_index_ % 3 != 0)
      return;
    buffer -= sep_.size();
    std::uninitialized_copy(sep_.data(), sep_.data() + sep_.size(),
                            internal::make_checked(buffer, sep_.size()));
  }